

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O1

void __thiscall
QAbstractItemModelTesterPrivate::rowsInserted
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  Data *pDVar1;
  QObject *pQVar2;
  int *piVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  QObject *pQVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  Changing c;
  QDebug local_140;
  anon_union_24_3_e3d07ef4_for_data local_138;
  anon_union_24_3_e3d07ef4_for_data local_120;
  QDebug local_108;
  QDebug local_100;
  anon_union_24_3_e3d07ef4_for_data local_f8;
  undefined1 local_e0 [8];
  QVariant local_d8;
  undefined1 local_b8 [32];
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined1 *puStack_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._0_4_ = RowsInserted;
  bVar4 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)local_b8,"changeInFlight",
                     "ChangeInFlight::RowsInserted",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x348);
  if (!bVar4) goto LAB_0014ada8;
  this->changeInFlight = None;
  lcModelTest();
  if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_b8._0_4_ = ColumnsMoved;
    local_b8._4_4_ = 0;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_8_ = lcModelTest::category.name;
    QMessageLogger::debug();
    uVar9 = local_138.shared;
    QVar11.m_data = (storage_type *)0xc;
    QVar11.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_58);
    piVar3 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
      }
    }
    if (*(QTextStream *)(local_138.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_138.shared,' ');
    }
    uVar9 = local_138.shared;
    QVar12.m_data = (storage_type *)0x6;
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_58);
    piVar3 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
      }
    }
    if (*(QTextStream *)(local_138.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_138.shared,' ');
    }
    QTextStream::operator<<((QTextStream *)local_138.shared,start);
    if (*(QTextStream *)(local_138.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_138.shared,' ');
    }
    uVar9 = local_138.shared;
    QVar13.m_data = (storage_type *)0x4;
    QVar13.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_58);
    piVar3 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
      }
    }
    if (*(QTextStream *)(local_138.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_138.shared,' ');
    }
    QTextStream::operator<<((QTextStream *)local_138.shared,end);
    if (*(QTextStream *)(local_138.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_138.shared,' ');
    }
    uVar9 = local_138.shared;
    QVar14.m_data = (storage_type *)0x7;
    QVar14.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_58);
    piVar3 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
      }
    }
    if (*(QTextStream *)(local_138.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_138.shared,' ');
    }
    local_e0 = (undefined1  [8])local_138.shared;
    *(int *)(local_138.shared + 0x28) = *(int *)(local_138.shared + 0x28) + 1;
    operator<<((Stream *)&local_120,(QModelIndex *)local_e0);
    uVar9 = local_120.shared;
    QVar15.m_data = (storage_type *)0xc;
    QVar15.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_58);
    piVar3 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
      }
    }
    if (*(QTextStream *)(local_120.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_120.shared,' ');
    }
    pQVar10 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar10 + 0x90))(&local_58,pQVar10,parent,0);
    QVariant::toString();
    uVar9 = local_f8._8_8_;
    if ((undefined8 *)local_f8._8_8_ == (undefined8 *)0x0) {
      uVar9 = &QString::_empty;
    }
    QDebug::putString((QChar *)&local_120,uVar9);
    if (*(QTextStream *)(local_120.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_120.shared,' ');
    }
    uVar9 = local_120.shared;
    QVar16.m_data = (storage_type *)0x18;
    QVar16.m_size = (qsizetype)&local_d8;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_d8);
    if ((QArrayData *)local_d8.d.data.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_d8.d.data.shared = *(int *)local_d8.d.data.shared + -1;
      UNLOCK();
      if (*(int *)local_d8.d.data.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_d8.d.data.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_120.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_120.shared,' ');
    }
    pQVar10 = (this->model).wp.value;
    iVar6 = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10,parent);
    QTextStream::operator<<((QTextStream *)local_120.shared,iVar6);
    if (*(QTextStream *)(local_120.shared + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_120.shared,' ');
    }
    if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
      UNLOCK();
      if (*(int *)local_f8.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.shared,2,0x10);
      }
    }
    QVariant::~QVariant((QVariant *)&local_58);
    QDebug::~QDebug((QDebug *)&local_120.shared);
    QDebug::~QDebug((QDebug *)local_e0);
    QDebug::~QDebug((QDebug *)&local_138.shared);
  }
  if (start <= end) {
    iVar6 = start;
    do {
      lcModelTest();
      if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_b8._0_4_ = ColumnsMoved;
        local_b8._4_4_ = 0;
        local_b8._8_4_ = 0;
        local_b8._12_4_ = 0;
        local_b8._16_4_ = 0;
        local_b8._20_4_ = 0;
        local_b8._24_8_ = lcModelTest::category.name;
        QMessageLogger::debug();
        uVar9 = local_f8.shared;
        QVar17.m_data = (storage_type *)0x14;
        QVar17.m_size = (qsizetype)&local_58;
        QString::fromUtf8(QVar17);
        QTextStream::operator<<((QTextStream *)uVar9,(QString *)&local_58);
        piVar3 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
          }
        }
        if ((char)(((QArrayData *)(local_f8.shared + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_f8.shared,' ');
        }
        QTextStream::operator<<((QTextStream *)local_f8.shared,iVar6);
        if ((char)(((QArrayData *)(local_f8.shared + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_f8.shared,' ');
        }
        pQVar10 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar10 + 0x60))(&local_d8,pQVar10,iVar6,0,parent);
        if ((long *)local_d8.d.data._16_8_ == (long *)0x0) {
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          local_40 = (char *)0x2;
        }
        else {
          (**(code **)(*(long *)local_d8.d.data._16_8_ + 0x90))
                    (&local_58,local_d8.d.data._16_8_,&local_d8,0);
        }
        operator<<(&local_100,(QVariant *)&local_f8);
        QDebug::~QDebug(&local_100);
        QVariant::~QVariant((QVariant *)&local_58);
        QDebug::~QDebug((QDebug *)&local_f8.shared);
      }
      iVar6 = iVar6 + 1;
    } while (end + 1 != iVar6);
  }
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._16_4_ = 0xaaaaaaaa;
  local_b8._20_4_ = 0xaaaaaaaa;
  local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_4_ = 0xaaaaaaaa;
  local_b8._4_4_ = -0x55555556;
  local_b8._8_4_ = 0xaaaaaaaa;
  local_b8._12_4_ = 0xaaaaaaaa;
  QList<QAbstractItemModelTesterPrivate::Changing>::takeLast
            ((value_type *)local_b8,
             &(this->insert).super_QList<QAbstractItemModelTesterPrivate::Changing>);
  bVar4 = compare<QModelIndex,QModelIndex>
                    (this,parent,(QModelIndex *)local_b8,"parent","c.parent",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x357);
  if (bVar4) {
    pQVar10 = (this->model).wp.value;
    local_58._0_4_ = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10,parent);
    local_d8.d.data._0_4_ = local_b8._24_4_ + (end - start) + 1;
    bVar4 = compare<int,int>(this,(int *)local_58.data,(int *)&local_d8,"model->rowCount(parent)",
                             "c.oldSize + (end - start + 1)",
                             "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                             ,0x359);
    if (bVar4) {
      if (0 < start) {
        pDVar1 = (this->model).wp.d;
        if ((pDVar1 == (Data *)0x0) ||
           ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
          pQVar10 = (QObject *)0x0;
        }
        else {
          pQVar10 = (this->model).wp.value;
        }
        pQVar2 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar2 + 0x60))(&local_d8,pQVar2,start + -1,0,local_b8);
        (**(code **)(*(long *)pQVar10 + 0x90))(&local_58,pQVar10,&local_d8,0);
        bVar4 = compare<QVariant,QVariant>
                          (this,(QVariant *)&local_58,(QVariant *)&local_98,
                           "model->data(model->index(start - 1, 0, c.parent))","c.last",
                           "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                           ,0x35b);
        QVariant::~QVariant((QVariant *)&local_58);
        if (!bVar4) goto LAB_0014ad8e;
      }
      pQVar10 = (this->model).wp.value;
      iVar6 = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10,local_b8);
      iVar8 = end + 1;
      if (iVar8 < iVar6) {
        pDVar1 = (this->model).wp.d;
        if ((pDVar1 == (Data *)0x0) ||
           ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
          pQVar10 = (QObject *)0x0;
        }
        else {
          pQVar10 = (this->model).wp.value;
        }
        pQVar2 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar2 + 0x60))(&local_d8,pQVar2,iVar8,0,local_b8);
        (**(code **)(*(long *)pQVar10 + 0x90))(&local_58,pQVar10,&local_d8,0);
        cVar5 = QVariant::equals((QVariant *)&local_78);
        QVariant::~QVariant((QVariant *)&local_58);
        if (cVar5 == '\0') {
          local_58._0_4_ = 2;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          local_40 = "default";
          QMessageLogger::debug();
          QTextStream::operator<<((QTextStream *)local_d8.d.data.shared,start);
          if ((char)(((QArrayData *)(local_d8.d.data.shared + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_d8.d.data.shared,' ');
          }
          QTextStream::operator<<((QTextStream *)local_d8.d.data.shared,end);
          if ((char)(((QArrayData *)(local_d8.d.data.shared + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_d8.d.data.shared,' ');
          }
          QDebug::~QDebug((QDebug *)&local_d8);
          iVar6 = 0;
          while( true ) {
            pQVar10 = (this->model).wp.value;
            local_58._0_4_ = 0xffffffff;
            local_58._4_4_ = 0xffffffff;
            local_58._8_4_ = 0;
            local_58._12_4_ = 0;
            local_58._16_4_ = 0;
            local_58._20_4_ = 0;
            iVar7 = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10,&local_58);
            if (iVar7 <= iVar6) break;
            local_58._0_4_ = 2;
            local_58._4_4_ = 0;
            local_58._8_4_ = 0;
            local_58._12_4_ = 0;
            local_58._16_4_ = 0;
            local_58._20_4_ = 0;
            local_40 = "default";
            QMessageLogger::debug();
            pQVar10 = (this->model).wp.value;
            local_138._forAlignment = -NAN;
            local_138._8_8_ = 0;
            local_138._16_8_ = 0;
            (**(code **)(*(long *)pQVar10 + 0x60))(&local_120,pQVar10,iVar6,0,&local_138);
            if ((long *)local_120._16_8_ == (long *)0x0) {
              local_d8.d.data.shared = (PrivateShared *)0x0;
              local_d8.d.data._8_8_ = (QAbstractItemModel *)0x0;
              local_d8.d.data._16_8_ = (long *)0x0;
              local_d8.d._24_8_ = 2;
            }
            else {
              (**(code **)(*(long *)local_120._16_8_ + 0x90))
                        (&local_d8,local_120._16_8_,&local_120,0);
            }
            QVariant::toString();
            uVar9 = local_f8._8_8_;
            if ((undefined8 *)local_f8._8_8_ == (undefined8 *)0x0) {
              uVar9 = &QString::_empty;
            }
            QDebug::putString((QChar *)&local_108,uVar9);
            if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_108.stream,' ');
            }
            if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
              UNLOCK();
              if (*(int *)local_f8.shared == 0) {
                QArrayData::deallocate((QArrayData *)local_f8.shared,2,0x10);
              }
            }
            QVariant::~QVariant(&local_d8);
            QDebug::~QDebug(&local_108);
            iVar6 = iVar6 + 1;
          }
          local_58._0_4_ = 2;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          local_40 = "default";
          QMessageLogger::debug();
          operator<<((QDebug *)&local_120.shared,(QVariant *)&local_138);
          pDVar1 = (this->model).wp.d;
          if ((pDVar1 == (Data *)0x0) ||
             ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
            pQVar10 = (QObject *)0x0;
          }
          else {
            pQVar10 = (this->model).wp.value;
          }
          pQVar2 = (this->model).wp.value;
          (**(code **)(*(long *)pQVar2 + 0x60))(&local_f8,pQVar2,iVar8,0,local_b8);
          (**(code **)(*(long *)pQVar10 + 0x90))(&local_d8,pQVar10,&local_f8,0);
          operator<<(&local_140,(QVariant *)&local_120);
          QDebug::~QDebug(&local_140);
          QVariant::~QVariant(&local_d8);
          QDebug::~QDebug((QDebug *)&local_120.shared);
          QDebug::~QDebug((QDebug *)&local_138.shared);
        }
        pDVar1 = (this->model).wp.d;
        if ((pDVar1 == (Data *)0x0) ||
           ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
          pQVar10 = (QObject *)0x0;
        }
        else {
          pQVar10 = (this->model).wp.value;
        }
        pQVar2 = (this->model).wp.value;
        (**(code **)(*(long *)pQVar2 + 0x60))(&local_d8,pQVar2,iVar8,0,local_b8);
        (**(code **)(*(long *)pQVar10 + 0x90))(&local_58,pQVar10,&local_d8,0);
        compare<QVariant,QVariant>
                  (this,(QVariant *)&local_58,(QVariant *)&local_78,
                   "model->data(model->index(end + 1, 0, c.parent))","c.next",
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x365);
        QVariant::~QVariant((QVariant *)&local_58);
      }
    }
  }
LAB_0014ad8e:
  QVariant::~QVariant((QVariant *)&local_78);
  QVariant::~QVariant((QVariant *)&local_98);
LAB_0014ada8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsInserted(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::RowsInserted);
    changeInFlight = ChangeInFlight::None;

    qCDebug(lcModelTest) << "rowsInserted"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent);

    for (int i = start; i <= end; ++i) {
        qCDebug(lcModelTest) << "    itemWasInserted:" << i
                             << model->index(i, 0, parent).data();
    }


    Changing c = insert.pop();
    MODELTESTER_COMPARE(parent, c.parent);

    MODELTESTER_COMPARE(model->rowCount(parent), c.oldSize + (end - start + 1));
    if (start - 1 >= 0)
        MODELTESTER_COMPARE(model->data(model->index(start - 1, 0, c.parent)), c.last);

    if (end + 1 < model->rowCount(c.parent)) {
        if (c.next != model->data(model->index(end + 1, 0, c.parent))) {
            qDebug() << start << end;
            for (int i = 0; i < model->rowCount(); ++i)
                qDebug() << model->index(i, 0).data().toString();
            qDebug() << c.next << model->data(model->index(end + 1, 0, c.parent));
        }

        MODELTESTER_COMPARE(model->data(model->index(end + 1, 0, c.parent)), c.next);
    }
}